

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_Sum(SumForm1 Sum)

{
  byte value;
  uint32_t uVar1;
  Image input;
  ImageTemplate<unsigned_char> local_40;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_40,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&local_40);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_40);
  uVar1 = (*Sum)(&input);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return uVar1 == value * input._width * input._height;
}

Assistant:

bool form1_Sum(SumForm1 Sum)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        return Sum( input ) == intensity * input.width() * input.height();
    }